

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.c
# Opt level: O2

void gdImageChar(gdImagePtr im,gdFontPtr f,int x,int y,int c,int color)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int x_00;
  int iVar6;
  int iVar7;
  int y_00;
  
  iVar1 = f->offset;
  if ((iVar1 <= c) && (c < iVar1 + f->nchars)) {
    iVar3 = f->w;
    iVar4 = f->h;
    iVar6 = iVar4 * iVar3;
    iVar5 = 0;
    iVar2 = iVar3;
    for (y_00 = y; iVar7 = iVar6 * (c - iVar1), x_00 = x, y_00 < iVar4 + y; y_00 = y_00 + 1) {
      for (; x_00 < iVar3 + x; x_00 = x_00 + 1) {
        iVar4 = iVar3 * iVar5;
        iVar3 = iVar2;
        if (f->data[iVar4 + iVar7] != '\0') {
          gdImageSetPixel(im,x_00,y_00,color);
          iVar3 = f->w;
        }
        iVar2 = iVar3;
        iVar7 = iVar7 + 1;
      }
      iVar5 = iVar5 + 1;
      iVar4 = f->h;
    }
  }
  return;
}

Assistant:

BGD_DECLARE(void) gdImageChar (gdImagePtr im, gdFontPtr f, int x, int y, int c, int color)
{
	int cx, cy;
	int px, py;
	int fline;
	cx = 0;
	cy = 0;
#ifdef CHARSET_EBCDIC
	c = ASC (c);
#endif /*CHARSET_EBCDIC */
	if ((c < f->offset) || (c >= (f->offset + f->nchars))) {
		return;
	}
	fline = (c - f->offset) * f->h * f->w;
	for (py = y; (py < (y + f->h)); py++) {
		for (px = x; (px < (x + f->w)); px++) {
			if (f->data[fline + cy * f->w + cx]) {
				gdImageSetPixel (im, px, py, color);
			}
			cx++;
		}
		cx = 0;
		cy++;
	}
}